

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

u32string * __thiscall
test_parser::serialize_u32_abi_cxx11_
          (u32string *__return_storage_ptr__,test_parser *this,object *in_object)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *in_string;
  long *local_30 [2];
  long local_20 [2];
  
  (**(code **)((long)*this + 0x30))((jessilib *)local_30);
  jessilib::string_cast<char32_t,std::__cxx11::u8string>
            (__return_storage_ptr__,(jessilib *)local_30,in_string);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::u32string serialize_u32(const object& in_object) override { return string_cast<char32_t>(serialize_u8(in_object)); }